

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::ListType::ByteSizeLong(ListType *this)

{
  bool bVar1;
  int size;
  size_t sVar2;
  long lVar3;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  ListType *this_local;
  
  _cached_size = 0;
  bVar1 = _internal_has_type(this);
  if (bVar1) {
    _cached_size = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::MILSpec::ValueType>(this->type_);
    _cached_size = _cached_size + 1;
  }
  bVar1 = _internal_has_length(this);
  if (bVar1) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Dimension>(this->length_);
    _cached_size = sVar2 + 1 + _cached_size;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _cached_size = lVar3 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t ListType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.ListType)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.ValueType type = 1;
  if (this->_internal_has_type()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *type_);
  }

  // .CoreML.Specification.MILSpec.Dimension length = 2;
  if (this->_internal_has_length()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *length_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}